

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

bool __thiscall cmProcess::StartProcess(cmProcess *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  cmsysProcess *pcVar4;
  reference command;
  char *dir;
  double dVar5;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_48;
  value_type local_40;
  value_type local_38;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  iterator i;
  cmProcess *this_local;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    dVar5 = cmsys::SystemTools::GetTime();
    this->StartTime = dVar5;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::clear(&this->ProcessArgs);
    i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&this->ProcessArgs,(value_type *)&i);
    local_28._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->Arguments);
    while( true ) {
      local_30._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->Arguments);
      bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_28);
      local_38 = (value_type)std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                (&this->ProcessArgs,&local_38);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_28);
    }
    local_40 = (value_type)0x0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&this->ProcessArgs,&local_40);
    pcVar4 = cmsysProcess_New();
    this->Process = pcVar4;
    pcVar4 = this->Process;
    local_48._M_current =
         (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                            (&this->ProcessArgs);
    command = __gnu_cxx::
              __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&local_48);
    cmsysProcess_SetCommand(pcVar4,command);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pcVar4 = this->Process;
      dir = (char *)std::__cxx11::string::c_str();
      cmsysProcess_SetWorkingDirectory(pcVar4,dir);
    }
    cmsysProcess_SetTimeout(this->Process,this->Timeout);
    cmsysProcess_SetOption(this->Process,2,1);
    cmsysProcess_Execute(this->Process);
    iVar2 = cmsysProcess_GetState(this->Process);
    this_local._7_1_ = iVar2 == 3;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmProcess::StartProcess()
{
  if (this->Command.empty()) {
    return false;
  }
  this->StartTime = cmSystemTools::GetTime();
  this->ProcessArgs.clear();
  // put the command as arg0
  this->ProcessArgs.push_back(this->Command.c_str());
  // now put the command arguments in
  for (std::vector<std::string>::iterator i = this->Arguments.begin();
       i != this->Arguments.end(); ++i) {
    this->ProcessArgs.push_back(i->c_str());
  }
  this->ProcessArgs.push_back(CM_NULLPTR); // null terminate the list
  this->Process = cmsysProcess_New();
  cmsysProcess_SetCommand(this->Process, &*this->ProcessArgs.begin());
  if (!this->WorkingDirectory.empty()) {
    cmsysProcess_SetWorkingDirectory(this->Process,
                                     this->WorkingDirectory.c_str());
  }
  cmsysProcess_SetTimeout(this->Process, this->Timeout);
  cmsysProcess_SetOption(this->Process, cmsysProcess_Option_MergeOutput, 1);
  cmsysProcess_Execute(this->Process);
  return (cmsysProcess_GetState(this->Process) ==
          cmsysProcess_State_Executing);
}